

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

Map<int,_google::protobuf::FieldMask> * __thiscall
google::protobuf::internal::TypeDefinedMapFieldBase<int,_google::protobuf::FieldMask>::MutableMap
          (TypeDefinedMapFieldBase<int,_google::protobuf::FieldMask> *this)

{
  MapFieldBase::SyncMapWithRepeatedField(&this->super_MapFieldBase);
  MapFieldBase::SetMapDirty(&this->super_MapFieldBase);
  return (Map<int,_google::protobuf::FieldMask> *)&this->field_0;
}

Assistant:

Map<Key, T>* MutableMap() {
    SyncMapWithRepeatedField();
    SetMapDirty();
    return &map_;
  }